

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

string * __thiscall
(anonymous_namespace)::getLinkLibraryStyle_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,LinkLibraryScopeType *type)

{
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (*(int *)this == 2) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"dotted",&local_71);
    std::operator+(&local_50,"[style = ",&local_70);
    std::operator+(&local_30,&local_50,"]");
  }
  else {
    if (*(int *)this != 1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"dashed",&local_71);
    std::operator+(&local_50,"[style = ",&local_70);
    std::operator+(&local_30,&local_50,"]");
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkLibraryStyle(const LinkLibraryScopeType& type)
{
  std::string style;
  switch (type) {
    case LLT_SCOPE_PRIVATE:
      style = "[style = " + std::string(GRAPHVIZ_PRIVATE_EDEGE_STYLE) + "]";
      break;
    case LLT_SCOPE_INTERFACE:
      style = "[style = " + std::string(GRAPHVIZ_INTERFACE_EDEGE_STYLE) + "]";
      break;
    default:
      break;
  }
  return style;
}